

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

int CVodeSensEEtolerances(void *cvode_mem)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x8ba;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x860) != 0) {
      *(undefined4 *)((long)cvode_mem + 0xe4) = 4;
      return 0;
    }
    msgfmt = "Forward sensitivity analysis not activated.";
    iVar1 = -0x28;
    error_code = -0x28;
    line = 0x8c3;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSensEEtolerances",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeSensEEtolerances(void* cvode_mem)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was sensitivity initialized? */

  if (cv_mem->cv_SensMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  cv_mem->cv_itolS = CV_EE;

  return (CV_SUCCESS);
}